

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_FFDHE.c
# Opt level: O3

void ffdhe_compute_exp(Spec_FFDHE_ffdhe_alg a,uint64_t *p_r2_n,uint64_t *sk_n,uint64_t *b_n,
                      uint8_t *res)

{
  byte *pbVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint8_t *res_00;
  uint64_t uVar5;
  ulong *puVar6;
  long lVar7;
  uint8_t *pk;
  uint8_t *extraout_RDX;
  long *extraout_RDX_00;
  uint8_t *pk_00;
  void *extraout_RDX_01;
  size_t sVar8;
  byte bVar9;
  uint32_t uVar10;
  undefined7 in_register_00000039;
  void *__s;
  uint64_t *res_01;
  void *__s_00;
  uint uVar11;
  uint64_t *res_02;
  ulong *__s_01;
  uint64_t *puVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  uint64_t auStack_438 [29];
  undefined8 uStack_350;
  uint64_t auStack_338 [29];
  undefined8 uStack_250;
  uint64_t auStack_238 [13];
  undefined8 uStack_1d0;
  uint64_t auStack_1b8 [6];
  undefined8 uStack_188;
  void *pvStack_180;
  code *pcStack_150;
  code *pcStack_118;
  void *pvStack_110;
  size_t sStack_108;
  uint64_t *puStack_100;
  long lStack_f8;
  void *pvStack_f0;
  code *pcStack_c0;
  uint64_t *apuStack_b8 [2];
  uint8_t *puStack_a8;
  ulong uStack_a0;
  uint8_t *puStack_98;
  code *pcStack_68;
  code *pcStack_40;
  uint64_t *local_38;
  
  uVar13 = CONCAT71(in_register_00000039,a);
  switch(uVar13 & 0xffffffff) {
  case 0:
    local_38 = p_r2_n + 0x20;
    puVar12 = (uint64_t *)&stack0xfffffffffffffec8;
    memset(puVar12,0,0x100);
    uVar5 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(*p_r2_n);
    pcStack_150 = (code *)0x15ebc6;
    Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64
              (0x20,p_r2_n,uVar5,local_38,b_n,0x800,sk_n,puVar12);
    uVar10 = 0x100;
    break;
  case 1:
    local_38 = p_r2_n + 0x30;
    puVar12 = auStack_1b8;
    memset(puVar12,0,0x180);
    uVar5 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(*p_r2_n);
    uStack_1d0 = 0x15ed3f;
    Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64
              (0x30,p_r2_n,uVar5,local_38,b_n,0xc00,sk_n,puVar12);
    uVar10 = 0x180;
    break;
  case 2:
    local_38 = p_r2_n + 0x40;
    puVar12 = auStack_238;
    memset(puVar12,0,0x200);
    uVar5 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(*p_r2_n);
    uStack_250 = 0x15ec84;
    Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64
              (0x40,p_r2_n,uVar5,local_38,b_n,0x1000,sk_n,puVar12);
    uVar10 = 0x200;
    break;
  case 3:
    local_38 = p_r2_n + 0x60;
    puVar12 = auStack_338;
    memset(puVar12,0,0x300);
    uVar5 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(*p_r2_n);
    uStack_350 = 0x15ece3;
    Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64
              (0x60,p_r2_n,uVar5,local_38,b_n,0x1800,sk_n,puVar12);
    uVar10 = 0x300;
    break;
  case 4:
    local_38 = p_r2_n + 0x80;
    puVar12 = auStack_438;
    memset(puVar12,0,0x400);
    uVar5 = Hacl_Bignum_ModInvLimb_mod_inv_uint64(*p_r2_n);
    Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64
              (0x80,p_r2_n,uVar5,local_38,b_n,0x2000,sk_n,puVar12);
    uVar10 = 0x400;
    break;
  default:
    pcStack_40 = Hacl_FFDHE_ffdhe_secret_to_public;
    ffdhe_compute_exp_cold_1();
    bVar9 = (byte)uVar13;
    if (bVar9 < 5) {
      lVar15 = *(long *)(&DAT_001dbc38 + (uVar13 & 0xff) * 8);
      lVar7 = -(lVar15 * 8 + 0xfU & 0xfffffffffffffff0);
      puVar12 = (uint64_t *)(&stack0xffffffffffffffa0 + lVar7);
      pcStack_40 = (code *)&stack0xfffffffffffffff8;
      *(undefined8 *)((long)&pcStack_68 + lVar7) = 0x15edb0;
      memset(puVar12,0,lVar15 << 3);
      *(undefined8 *)((long)&pcStack_68 + lVar7) = 0x15edbb;
      ffdhe_precomp_p(bVar9,puVar12);
      *(undefined8 *)((long)&pcStack_68 + lVar7) = 0x15edcc;
      Hacl_FFDHE_ffdhe_secret_to_public_precomp(bVar9,puVar12,(uint8_t *)p_r2_n,pk);
      return;
    }
    pcStack_68 = Hacl_FFDHE_ffdhe_shared_secret_precomp;
    pcStack_40 = (code *)&stack0xfffffffffffffff8;
    Hacl_FFDHE_ffdhe_secret_to_public_cold_1();
    apuStack_b8[0] = p_r2_n;
    apuStack_b8[1] = b_n;
    puStack_98 = res;
    if ((byte)uVar13 < 5) {
      uStack_a0 = uVar13 & 0xff;
      uVar10 = *(uint32_t *)(&DAT_001dbc10 + uStack_a0 * 4);
      uVar13 = (ulong)(uVar10 - 1 & 0xfffffff8);
      uVar14 = uVar13 + 0x17 & 0xfffffffffffffff0;
      lVar15 = -uVar14;
      res_02 = (uint64_t *)((long)apuStack_b8 + lVar15);
      sVar8 = uVar13 + 8;
      puStack_a8 = extraout_RDX;
      pcStack_68 = (code *)&pcStack_40;
      *(undefined8 *)((long)&pcStack_c0 + lVar15) = 0x15ee45;
      memset(res_02,0,sVar8);
      uVar13 = uStack_a0;
      res_01 = (uint64_t *)((long)res_02 - uVar14);
      res_01[-1] = 0x15ee5f;
      memset(res_01,0,sVar8);
      res_01[-1] = 0x15ee6e;
      Hacl_Bignum_Convert_bn_from_bytes_be_uint64(uVar10,puStack_a8,res_02);
      puVar12 = apuStack_b8[1];
      res_01[-1] = 0x15ee7d;
      Hacl_Bignum_Convert_bn_from_bytes_be_uint64(uVar10,(uint8_t *)puVar12,res_01);
      puVar12 = apuStack_b8[0];
      res_01[-1] = 0x15ee8f;
      uVar5 = ffdhe_check_pk((Spec_FFDHE_ffdhe_alg)uVar13,res_01,puVar12);
      res_00 = puStack_98;
      if (uVar5 == 0xffffffffffffffff) {
        res_01[-1] = 0x15eead;
        ffdhe_compute_exp((Spec_FFDHE_ffdhe_alg)uVar13,puVar12,res_02,res_01,res_00);
      }
      return;
    }
    pcStack_c0 = ffdhe_check_pk;
    pcStack_68 = (code *)&pcStack_40;
    Hacl_FFDHE_ffdhe_shared_secret_precomp_cold_1();
    puStack_100 = p_r2_n;
    if ((byte)uVar13 < 5) {
      uVar11 = *(uint *)(&DAT_001dbc24 + (uVar13 & 0xff) * 4);
      pvStack_f0 = (void *)(ulong)(uVar11 >> 3);
      uVar13 = (ulong)(uVar11 & 0xfffffff8) + 0x17 & 0xfffffffffffffff0;
      lVar15 = -uVar13;
      __s_00 = (void *)((long)&pvStack_110 + lVar15);
      sVar8 = (long)pvStack_f0 * 8 + 8;
      lStack_f8 = (long)pvStack_f0 + 1;
      sStack_108 = sVar8;
      pcStack_c0 = (code *)&pcStack_68;
      *(undefined8 *)((long)&pcStack_118 + lVar15) = 0x15ef3a;
      memset(__s_00,0,sVar8);
      bVar16 = *extraout_RDX_00 == 0;
      *(long *)((long)&pvStack_110 - uVar13) = *extraout_RDX_00 + -1;
      uVar11 = uVar11 >> 5;
      uVar13 = (ulong)uVar11;
      lVar7 = 0x20;
      do {
        uVar14 = *(ulong *)((long)extraout_RDX_00 + lVar7 + -0x18);
        *(ulong *)(&stack0xfffffffffffffed8 + lVar7 + lVar15) = uVar14 - bVar16;
        uVar2 = *(ulong *)((long)extraout_RDX_00 + lVar7 + -0x10);
        uVar4 = (ulong)(uVar14 < bVar16);
        *(ulong *)(&stack0xfffffffffffffee0 + lVar7 + lVar15) = uVar2 - uVar4;
        uVar14 = *(ulong *)((long)extraout_RDX_00 + lVar7 + -8);
        uVar2 = (ulong)(uVar2 < uVar4);
        *(ulong *)((long)&pcStack_118 + lVar7 + lVar15) = uVar14 - uVar2;
        uVar14 = (ulong)(uVar14 < uVar2);
        bVar16 = *(ulong *)((long)extraout_RDX_00 + lVar7) < uVar14;
        *(ulong *)((long)__s_00 + lVar7) = *(ulong *)((long)extraout_RDX_00 + lVar7) - uVar14;
        lVar7 = lVar7 + 0x20;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
      if (uVar11 << 2 < (uint)pvStack_f0) {
        uVar13 = (ulong)(uVar11 * 4);
        do {
          uVar14 = (ulong)bVar16;
          bVar16 = (ulong)extraout_RDX_00[uVar13 + 1] < uVar14;
          *(ulong *)((long)&sStack_108 + uVar13 * 8 + lVar15) = extraout_RDX_00[uVar13 + 1] - uVar14
          ;
          uVar13 = uVar13 + 1;
        } while (((ulong)pvStack_f0 & 0xffffffff) != uVar13);
      }
      sVar8 = sStack_108;
      uVar13 = lStack_f8 * 8 + 0xfU & 0xfffffffffffffff0;
      __s = (void *)((long)__s_00 - uVar13);
      lVar15 = 0;
      pvStack_110 = __s_00;
      pvStack_f0 = __s;
      *(undefined8 *)((long)__s + -8) = 0x15f000;
      memset(__s,0,sVar8);
      pbVar1 = (byte *)((long)__s_00 - uVar13);
      *pbVar1 = *pbVar1 | 1;
      do {
        uVar5 = *(uint64_t *)((long)pvStack_f0 + lVar15 * 8);
        uVar3 = puStack_100[lVar15];
        *(undefined8 *)((long)__s + -8) = 0x15f023;
        FStar_UInt64_eq_mask(uVar5,uVar3);
        *(undefined8 *)((long)__s + -8) = 0x15f031;
        FStar_UInt64_gte_mask(uVar5,uVar3);
        lVar15 = lVar15 + 1;
      } while (lStack_f8 != lVar15);
      lVar15 = 0;
      do {
        uVar5 = puStack_100[lVar15];
        uVar3 = *(uint64_t *)((long)pvStack_110 + lVar15 * 8);
        *(undefined8 *)((long)__s + -8) = 0x15f06d;
        pvStack_f0 = (void *)FStar_UInt64_eq_mask(uVar5,uVar3);
        *(undefined8 *)((long)__s + -8) = 0x15f07c;
        FStar_UInt64_gte_mask(uVar5,uVar3);
        lVar15 = lVar15 + 1;
      } while (lStack_f8 != lVar15);
      return;
    }
    pcStack_118 = Hacl_FFDHE_ffdhe_shared_secret;
    pcStack_c0 = (code *)&pcStack_68;
    ffdhe_check_pk_cold_1();
    uVar11 = (uint)uVar13;
    bVar9 = (byte)uVar13;
    if (4 < bVar9) {
      pcStack_150 = Hacl_Bignum_Convert_bn_to_bytes_be_uint64;
      pcStack_118 = (code *)&pcStack_c0;
      Hacl_FFDHE_ffdhe_shared_secret_cold_1();
      uVar13 = (ulong)((uVar11 - 1 & 0xfffffff8) + 8);
      lVar15 = -(uVar13 + 0xf & 0xfffffffffffffff0);
      __s_01 = (ulong *)((long)&pvStack_180 + lVar15);
      pvStack_180 = extraout_RDX_01;
      pcStack_150 = (code *)&pcStack_118;
      *(undefined8 *)((long)&uStack_188 + lVar15) = 0x15f17e;
      memset(__s_01,0,uVar13);
      uVar14 = (ulong)(uVar11 - 1 >> 3);
      puVar6 = __s_01;
      do {
        uVar2 = p_r2_n[uVar14 & 0xffffffff];
        *puVar6 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                  (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                  (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28
                  | uVar2 << 0x38;
        puVar6 = puVar6 + 1;
        bVar16 = uVar14 != 0;
        uVar14 = uVar14 - 1;
      } while (bVar16);
      *(undefined8 *)((long)&uStack_188 + lVar15) = 0x15f1b1;
      memcpy(pvStack_180,(void *)((long)__s_01 + (uVar13 - uVar11)),(ulong)uVar11);
      return;
    }
    lVar15 = *(long *)(&DAT_001dbc38 + (uVar13 & 0xff) * 8);
    lVar7 = -(lVar15 * 8 + 0xfU & 0xfffffffffffffff0);
    puVar12 = (uint64_t *)(&stack0xfffffffffffffeb8 + lVar7);
    pcStack_118 = (code *)&pcStack_c0;
    *(undefined8 *)((long)&pcStack_150 + lVar7) = 0x15f108;
    memset(puVar12,0,lVar15 << 3);
    *(undefined8 *)((long)&pcStack_150 + lVar7) = 0x15f113;
    ffdhe_precomp_p(bVar9,puVar12);
    *(undefined8 *)((long)&pcStack_150 + lVar7) = 0x15f127;
    Hacl_FFDHE_ffdhe_shared_secret_precomp(bVar9,puVar12,(uint8_t *)p_r2_n,pk_00,(uint8_t *)b_n);
    return;
  }
  puVar12[-1] = 0x15ed53;
  Hacl_Bignum_Convert_bn_to_bytes_be_uint64(uVar10,puVar12,res);
  return;
}

Assistant:

static inline void
ffdhe_compute_exp(
  Spec_FFDHE_ffdhe_alg a,
  uint64_t *p_r2_n,
  uint64_t *sk_n,
  uint64_t *b_n,
  uint8_t *res
)
{
  uint32_t nLen = (ffdhe_len(a) - 1U) / 8U + 1U;
  uint64_t *p_n = p_r2_n;
  uint64_t *r2_n = p_r2_n + nLen;
  KRML_CHECK_SIZE(sizeof (uint64_t), nLen);
  uint64_t res_n[nLen];
  memset(res_n, 0U, nLen * sizeof (uint64_t));
  uint64_t mu = Hacl_Bignum_ModInvLimb_mod_inv_uint64(p_n[0U]);
  Hacl_Bignum_Exponentiation_bn_mod_exp_consttime_precomp_u64((ffdhe_len(a) - 1U) / 8U + 1U,
    p_n,
    mu,
    r2_n,
    b_n,
    64U * nLen,
    sk_n,
    res_n);
  Hacl_Bignum_Convert_bn_to_bytes_be_uint64(ffdhe_len(a), res_n, res);
}